

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_state.hxx
# Opt level: O0

ptr<srv_state> nuraft::srv_state::deserialize_v1p(buffer *buf)

{
  uint8_t uVar1;
  buffer *in_RSI;
  element_type *in_RDI;
  ptr<nuraft::srv_state> pVar2;
  ptr<srv_state> pVar3;
  bool et_allowed;
  int voted_for;
  ulong term;
  uint8_t ver;
  buffer_serializer bs;
  bool *in_stack_ffffffffffffffa8;
  element_type *args;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  buffer_serializer *in_stack_ffffffffffffffe0;
  
  args = in_RDI;
  buffer_serializer::buffer_serializer((buffer_serializer *)&stack0xffffffffffffffd8,in_RSI,LITTLE);
  uVar1 = buffer_serializer::get_u8
                    ((buffer_serializer *)
                     CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  buffer_serializer::get_u64(in_stack_ffffffffffffffe0);
  buffer_serializer::get_i32(in_stack_ffffffffffffffe0);
  buffer_serializer::get_u8((buffer_serializer *)CONCAT17(uVar1,in_stack_ffffffffffffffd0));
  pVar2 = cs_new<nuraft::srv_state,unsigned_long&,int&,bool&>
                    ((unsigned_long *)args,(int *)in_RDI,in_stack_ffffffffffffffa8);
  pVar3.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       pVar2.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pVar3.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr = args;
  return (ptr<srv_state>)pVar3.super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ptr<srv_state> deserialize_v1p(buffer& buf) {
        buffer_serializer bs(buf);
        uint8_t ver = bs.get_u8();
        (void)ver;
        ulong term = bs.get_u64();
        int voted_for = bs.get_i32();
        bool et_allowed = (bs.get_u8() == 1);
        return cs_new<srv_state>(term, voted_for, et_allowed);
    }